

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O0

int MpiWaitForCompletion(CP_Services Svcs,void *Handle_v)

{
  uint uVar1;
  char *pcVar2;
  void *in_RSI;
  undefined8 *in_RDI;
  char *LoadedBuffer;
  MpiStreamWR StreamWR;
  int Ret;
  _MpiReadRequestMsg Request;
  MpiCompletionHandle Handle;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  undefined4 local_48 [2];
  undefined8 local_40;
  size_t local_38;
  long local_30;
  long local_20;
  void *local_18;
  undefined8 *local_8;
  
  local_18 = in_RSI;
  local_8 = in_RDI;
  memcpy(local_48,in_RSI,0x30);
  uVar3 = 0;
  (*(code *)*local_8)(*(undefined8 *)((long)local_18 + 0x38),5,
                      "Waiting for completion of memory read to rank %d, condition %d,timestep=%d, is_local=%d\n"
                      ,*(undefined4 *)((long)local_18 + 0x48),local_48[0],local_40,
                      *(undefined4 *)((long)local_18 + 0x4c));
  if (*(int *)((long)local_18 + 0x4c) == 1) {
    pcVar2 = LoadTimeStep((MpiStreamWR)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                          *(size_t *)(local_20 + 0x18));
    if (pcVar2 != (char *)0x0) {
      memcpy(*(void **)((long)local_18 + 0x40),pcVar2 + local_30,local_38);
    }
    uVar1 = (uint)(pcVar2 != (char *)0x0);
  }
  else {
    uVar1 = CMCondition_wait(*(undefined8 *)((long)local_18 + 0x30),local_48[0]);
  }
  if (uVar1 == 0) {
    (*(code *)*local_8)(*(undefined8 *)((long)local_18 + 0x38),1,
                        "Remote memory read to rank %d with condition %d has FAILEDbecause of writer failure\n"
                        ,*(undefined4 *)((long)local_18 + 0x48),local_48[0]);
  }
  else {
    (*(code *)*local_8)(*(undefined8 *)((long)local_18 + 0x38),5,
                        "Memory read to rank %d with condition %d andlength %zu has completed\n",
                        *(undefined4 *)((long)local_18 + 0x48),local_48[0],local_38);
  }
  free(local_18);
  return uVar1;
}

Assistant:

static int MpiWaitForCompletion(CP_Services Svcs, void *Handle_v)
{
    const MpiCompletionHandle Handle = (MpiCompletionHandle)Handle_v;
    const struct _MpiReadRequestMsg Request = Handle->ReadRequest;
    int Ret = 0;

    Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                  "Waiting for completion of memory read to rank %d, condition %d,"
                  "timestep=%d, is_local=%d\n",
                  Handle->DestinationRank, Request.NotifyCondition, Request.TimeStep,
                  Handle->CommType);

    // If possible, read locally
    if (Handle->CommType == MPI_DP_LOCAL)
    {
        const MpiStreamWR StreamWR = ((MpiStreamWPR)Request.StreamWPR)->StreamWR;
        char *LoadedBuffer = LoadTimeStep(StreamWR, Request.TimeStep);
        if (LoadedBuffer)
        {
            memcpy(Handle->Buffer, LoadedBuffer + Request.Offset, Request.Length);
        }
        Ret = (LoadedBuffer != NULL);
    }
    // Otherwise, wait for remote read
    else
    {
        Ret = CMCondition_wait(Handle->cm, Request.NotifyCondition);
    }

    // Display result
    if (Ret)
    {
        Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                      "Memory read to rank %d with condition %d and"
                      "length %zu has completed\n",
                      Handle->DestinationRank, Request.NotifyCondition, Request.Length);
    }
    else
    {
        Svcs->verbose(Handle->CPStream, DPCriticalVerbose,
                      "Remote memory read to rank %d with condition %d has FAILED"
                      "because of "
                      "writer failure\n",
                      Handle->DestinationRank, Request.NotifyCondition);
    }

    free(Handle);
    return Ret;
}